

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void SHA1PadMessage(SHA1Context *context,uint8_t Pad_Byte)

{
  short sVar1;
  uint8_t Pad_Byte_local;
  SHA1Context *context_local;
  
  if (context->Message_Block_Index < 0x38) {
    sVar1 = context->Message_Block_Index;
    context->Message_Block_Index = sVar1 + 1;
    context->Message_Block[sVar1] = Pad_Byte;
  }
  else {
    sVar1 = context->Message_Block_Index;
    context->Message_Block_Index = sVar1 + 1;
    context->Message_Block[sVar1] = Pad_Byte;
    while (context->Message_Block_Index < 0x40) {
      sVar1 = context->Message_Block_Index;
      context->Message_Block_Index = sVar1 + 1;
      context->Message_Block[sVar1] = '\0';
    }
    SHA1ProcessMessageBlock(context);
  }
  while (context->Message_Block_Index < 0x38) {
    sVar1 = context->Message_Block_Index;
    context->Message_Block_Index = sVar1 + 1;
    context->Message_Block[sVar1] = '\0';
  }
  context->Message_Block[0x38] = (uint8_t)(context->Length_High >> 0x18);
  context->Message_Block[0x39] = (uint8_t)(context->Length_High >> 0x10);
  context->Message_Block[0x3a] = (uint8_t)(context->Length_High >> 8);
  context->Message_Block[0x3b] = (uint8_t)context->Length_High;
  context->Message_Block[0x3c] = (uint8_t)(context->Length_Low >> 0x18);
  context->Message_Block[0x3d] = (uint8_t)(context->Length_Low >> 0x10);
  context->Message_Block[0x3e] = (uint8_t)(context->Length_Low >> 8);
  context->Message_Block[0x3f] = (uint8_t)context->Length_Low;
  SHA1ProcessMessageBlock(context);
  return;
}

Assistant:

static void SHA1PadMessage(SHA1Context *context, uint8_t Pad_Byte)
{
    /*
    * Check to see if the current message block is too small to hold
    * the initial padding bits and length. If so, we will pad the
    * block, process it, and then continue padding into a second
    * block.
    */
    if (context->Message_Block_Index >= (SHA1_Message_Block_Size - 8)) {
        context->Message_Block[context->Message_Block_Index++] = Pad_Byte;
        while (context->Message_Block_Index < SHA1_Message_Block_Size)
            context->Message_Block[context->Message_Block_Index++] = 0;

        SHA1ProcessMessageBlock(context);
    }
    else
        context->Message_Block[context->Message_Block_Index++] = Pad_Byte;

    while (context->Message_Block_Index < (SHA1_Message_Block_Size - 8))
        context->Message_Block[context->Message_Block_Index++] = 0;

    /*
    * Store the message length as the last 8 octets
    */
    context->Message_Block[56] = (uint8_t)(context->Length_High >> 24);
    context->Message_Block[57] = (uint8_t)(context->Length_High >> 16);

    context->Message_Block[58] = (uint8_t)(context->Length_High >> 8);
    context->Message_Block[59] = (uint8_t)(context->Length_High);
    context->Message_Block[60] = (uint8_t)(context->Length_Low >> 24);
    context->Message_Block[61] = (uint8_t)(context->Length_Low >> 16);
    context->Message_Block[62] = (uint8_t)(context->Length_Low >> 8);
    context->Message_Block[63] = (uint8_t)(context->Length_Low);

    SHA1ProcessMessageBlock(context);
}